

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  uint *puVar8;
  undefined4 extraout_var_01;
  locType extraout_RDX;
  long lVar9;
  locType wz;
  ulong uVar10;
  locType *plVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  uint tmpv [100];
  unsigned_long_long tmpk [100];
  int local_4ec;
  uint local_4e8;
  undefined1 local_4e4 [396];
  ulong local_358;
  undefined1 local_350 [800];
  node *pnVar7;
  undefined4 extraout_var_00;
  
  uVar3 = value->first;
  uVar1 = value->second;
  lVar6 = (long)this->depth;
  if (lVar6 == 0) {
    iVar4 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    puVar8 = (uint *)CONCAT44(extraout_var_00,iVar4);
    this->root = extraout_RDX;
    this->depth = 1;
    puVar8[400] = 1;
    *(ulong *)(puVar8 + 0xca) = uVar3;
    *puVar8 = uVar1;
    puVar8[200] = 0xffffffff;
    puVar8[0xc9] = 0xffffffff;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar14 = lVar6 * 8;
    uVar12 = lVar6 << 2;
    if (this->depth < 0) {
      uVar14 = 0xffffffffffffffff;
      uVar12 = 0xffffffffffffffff;
    }
    pos = (locType *)operator_new__(uVar14);
    *pos = 0;
    p = (node **)operator_new__(uVar14);
    pp = (int *)operator_new__(uVar12);
    *pos = this->root;
    iVar4 = this->depth;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        iVar4 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        pnVar7 = (node *)CONCAT44(extraout_var,iVar4);
        p[lVar6] = pnVar7;
        uVar2 = pnVar7->sz;
        uVar12 = (ulong)uVar2;
        bVar15 = 0 < (int)uVar2;
        if ((int)uVar2 < 1) {
          uVar14 = 0;
        }
        else {
          uVar14 = 0;
          if (pnVar7->keyvalue[0] < uVar3) {
            uVar10 = 0;
            do {
              if (uVar12 - 1 == uVar10) {
                bVar15 = uVar10 + 1 < uVar12;
                uVar14 = (ulong)uVar2;
                goto LAB_0010bfc4;
              }
              uVar14 = uVar10 + 1;
              lVar9 = uVar10 + 1;
              uVar10 = uVar14;
            } while (pnVar7->keyvalue[lVar9] < uVar3);
            bVar15 = uVar14 < uVar12;
          }
        }
LAB_0010bfc4:
        if (lVar6 < (long)this->depth + -1) {
          if (bVar15) {
            uVar14 = (ulong)(((int)uVar14 + 1) -
                            (uint)(uVar3 < pnVar7->keyvalue[uVar14 & 0xffffffff]));
          }
          pos[lVar6 + 1] = (pnVar7->field_0).pointer[(int)uVar14];
        }
        pp[lVar6] = (int)uVar14;
        lVar6 = lVar6 + 1;
        iVar4 = this->depth;
      } while (lVar6 < iVar4);
    }
    pnVar7 = p[(long)iVar4 + -1];
    iVar13 = (int)uVar14;
    if ((iVar13 < pnVar7->sz) && (pnVar7->keyvalue[iVar13] <= uVar3)) {
      operator_delete__(p);
      operator_delete__(pp);
      operator_delete__(pos);
      return false;
    }
    if (1 < iVar4 && iVar13 == 0) {
      plVar11 = pos + (iVar4 - 2);
      lVar6 = (ulong)(iVar4 - 2) + 1;
      do {
        lVar9 = (long)pp[lVar6 + -1];
        if ((lVar9 != 0) && (p[lVar6 + -1]->keyvalue[lVar9 + -1] == pnVar7->keyvalue[0])) {
          p[lVar6 + -1]->keyvalue[lVar9 + -1] = uVar3;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,plVar11);
          break;
        }
        plVar11 = plVar11 + -1;
        lVar9 = lVar6 + -1;
        bVar15 = 0 < lVar6;
        lVar6 = lVar9;
      } while (lVar9 != 0 && bVar15);
    }
    lVar6 = (long)p[(long)iVar4 + -1]->sz;
    if (lVar6 < 99) {
      if (iVar13 < p[(long)iVar4 + -1]->sz) {
        do {
          pnVar7 = p[(long)iVar4 + -1];
          pnVar7->keyvalue[lVar6] = pnVar7->keyvalue[lVar6 + -1];
          (pnVar7->field_0).val[lVar6] = *(uint *)((long)pnVar7 + lVar6 * 4 + -4);
          lVar6 = lVar6 + -1;
        } while (iVar13 < lVar6);
      }
      pnVar7 = p[(long)iVar4 + -1];
      pnVar7->keyvalue[iVar13] = uVar3;
      (pnVar7->field_0).val[iVar13] = uVar1;
      p[(long)iVar4 + -1]->sz = p[(long)iVar4 + -1]->sz + 1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      iVar5 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      lVar6 = CONCAT44(extraout_var_01,iVar5);
      if (0 < iVar13) {
        pnVar7 = p[(long)iVar4 + -1];
        memcpy(&local_4e8,pnVar7,(uVar14 & 0xffffffff) * 4);
        memcpy(&local_358,pnVar7->keyvalue,(uVar14 & 0xffffffff) << 3);
      }
      lVar9 = (long)iVar13;
      *(uint *)(local_4e4 + lVar9 * 4 + -4) = uVar1;
      *(ulong *)(local_350 + lVar9 * 8 + -8) = uVar3;
      if (iVar13 < 99) {
        pnVar7 = p[(long)iVar4 + -1];
        memcpy(local_4e4 + lVar9 * 4,(void *)((long)&pnVar7->field_0 + lVar9 * 4),
               (ulong)(0x62 - iVar13) * 4 + 4);
        memcpy(local_350 + lVar9 * 8,pnVar7->keyvalue + lVar9,(ulong)(0x62 - iVar13) * 8 + 8);
      }
      pnVar7 = p[(long)iVar4 + -1];
      *(locType *)(lVar6 + 800) = pnVar7->nxt;
      pnVar7->sz = 0x32;
      pnVar7 = p[(long)iVar4 + -1];
      iVar13 = pnVar7->sz;
      if (0 < iVar13) {
        lVar9 = 0;
        do {
          (pnVar7->field_0).val[lVar9] = *(uint *)(local_4e4 + lVar9 * 4 + -4);
          pnVar7 = p[(long)iVar4 + -1];
          pnVar7->keyvalue[lVar9] = *(unsigned_long_long *)(local_350 + lVar9 * 8 + -8);
          lVar9 = lVar9 + 1;
          iVar13 = pnVar7->sz;
        } while (lVar9 < iVar13);
      }
      pnVar7->nxt = wz;
      if (iVar13 < 100) {
        lVar9 = (long)iVar13;
        do {
          *(undefined4 *)(lVar6 + (long)p[(long)iVar4 + -1]->sz * -4 + lVar9 * 4) =
               *(undefined4 *)(local_4e4 + lVar9 * 4 + -4);
          *(undefined8 *)(lVar6 + (long)p[(long)iVar4 + -1]->sz * -8 + 0x328 + lVar9 * 8) =
               *(undefined8 *)(local_350 + lVar9 * 8 + -8);
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 100);
      }
      *(int *)(lVar6 + 0x640) = 100 - p[(long)iVar4 + -1]->sz;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      local_4ec = this->depth + -2;
      insertnonleaf(this,(unsigned_long_long *)(lVar6 + 0x328),&local_4ec,p,pp,pos,wz);
    }
    operator_delete__(p);
    operator_delete__(pp);
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }